

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correction.hpp
# Opt level: O2

void MGARD::compute_load_vector_vertical<float>
               (float *load_v_buffer,float *nodal_buffer,float *coeff_buffer,size_t n1_nodal,
               size_t n1_coeff,size_t stride,float h,int batchsize)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  bool bVar10;
  
  uVar6 = 0;
  uVar1 = 0;
  if (0 < batchsize) {
    uVar1 = (ulong)(uint)batchsize;
  }
  pfVar7 = nodal_buffer + stride;
  for (; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    load_v_buffer[uVar6] =
         pfVar7[uVar6] * 0.083333336 +
         coeff_buffer[uVar6] * 0.5 + nodal_buffer[uVar6] * 0.8333333 * 0.5;
  }
  lVar3 = (long)batchsize;
  pfVar5 = load_v_buffer + lVar3 * 2;
  pfVar8 = load_v_buffer + lVar3;
  pfVar9 = coeff_buffer + stride;
  pfVar4 = nodal_buffer + stride * 2;
  for (uVar6 = 1; uVar6 < n1_coeff; uVar6 = uVar6 + 1) {
    for (lVar2 = 0; uVar1 * 4 - lVar2 != 0; lVar2 = lVar2 + 4) {
      *(float *)((long)pfVar8 + lVar2) =
           *(float *)((long)pfVar7 + lVar2) * 0.8333333 +
           (*(float *)((long)nodal_buffer + lVar2) + *(float *)((long)pfVar4 + lVar2)) * 0.083333336
           + (*(float *)((long)coeff_buffer + lVar2) + *(float *)((long)pfVar9 + lVar2)) * 0.5;
    }
    pfVar5 = pfVar5 + lVar3;
    load_v_buffer = load_v_buffer + lVar3;
    nodal_buffer = nodal_buffer + stride;
    coeff_buffer = coeff_buffer + stride;
    pfVar8 = pfVar8 + lVar3;
    pfVar9 = pfVar9 + stride;
    pfVar7 = pfVar7 + stride;
    pfVar4 = pfVar4 + stride;
  }
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    load_v_buffer[lVar3 + uVar6] =
         nodal_buffer[stride + uVar6] * 0.8333333 * 0.5 +
         nodal_buffer[uVar6] * 0.083333336 + coeff_buffer[uVar6] * 0.5;
  }
  if (n1_coeff + 2 == n1_nodal) {
    while (bVar10 = uVar1 != 0, uVar1 = uVar1 - 1, bVar10) {
      *pfVar5 = 0.0;
      pfVar5 = pfVar5 + 1;
    }
  }
  return;
}

Assistant:

void compute_load_vector_vertical(T * load_v_buffer, const T * nodal_buffer, const T * coeff_buffer, size_t n1_nodal, size_t n1_coeff, size_t stride, T h, int batchsize){
    // T ah = h * 0.25; // derived constant in the formula
    // T ah = alpha * h;   // 1/12
    // T bh = beta * h;    // 1/2
    // T ch = gamma * h;   // 5/6
    // eliminate h for efficiency
    T ah = alpha;   // 1/12
    T bh = beta;    // 1/2
    T ch = gamma;   // 5/6
    T const * nodal_pos = nodal_buffer;
    T const * coeff_pos = coeff_buffer;
    T * load_v_pos = load_v_buffer;
    // first nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[j] * ah;
        load_v_pos[j] = nodal_pos[j] * ch / 2 + coeff_pos[j] * bh + nodal_pos[stride + j] * ah;
    }
    load_v_pos += batchsize;
    nodal_pos += stride;
    coeff_pos += stride;
    for(int i=1; i<n1_coeff; i++){
        for(int j=0; j<batchsize; j++){
            // load_v_pos[j] = (coeff_pos[-stride + j] + coeff_pos[j]) * ah;
            load_v_pos[j] = (nodal_pos[j - stride] + nodal_pos[j + stride]) * ah + (coeff_pos[j - stride] + coeff_pos[j]) * bh + nodal_pos[j] * ch;
        }
        load_v_pos += batchsize;
        nodal_pos += stride;
        coeff_pos += stride;
    }
    // last nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[-stride + j] * ah;
        load_v_pos[j] = nodal_pos[j - stride] * ah + coeff_pos[j - stride] * bh + nodal_pos[j] * ch / 2;
    }
    // if next n is even, load_v_buffer[n_nodal - 1] = 0
    if(n1_nodal == n1_coeff + 2){
        load_v_pos += batchsize;
        for(int j=0; j<batchsize; j++){
            load_v_pos[j] = 0;
        }
    }
}